

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

void mainchan_log_exit_signal_common(mainchan *mc,char *sigdesc,_Bool core_dumped,ptrlen msg)

{
  LogContext *ctx;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t s;
  char *msg_post;
  char *msg_pre;
  char *core_msg;
  PacketProtocolLayer *ppl;
  _Bool core_dumped_local;
  char *sigdesc_local;
  mainchan *mc_local;
  ptrlen msg_local;
  
  s = msg.len;
  pcVar2 = anon_var_dwarf_2471b + 10;
  if (core_dumped) {
    pcVar2 = " (core dumped)";
  }
  pcVar3 = anon_var_dwarf_2471b + 10;
  if (s != 0) {
    pcVar3 = " (";
  }
  pcVar4 = anon_var_dwarf_2471b + 10;
  if (s != 0) {
    pcVar4 = ")";
  }
  ctx = mc->ppl->logctx;
  uVar1 = string_length_for_printf(s);
  pcVar2 = dupprintf("Session exited on %s%s%s%.*s%s",sigdesc,pcVar2,pcVar3,(ulong)uVar1,msg.ptr,
                     pcVar4);
  logevent_and_free(ctx,pcVar2);
  return;
}

Assistant:

static void mainchan_log_exit_signal_common(
    mainchan *mc, const char *sigdesc,
    bool core_dumped, ptrlen msg)
{
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    const char *core_msg = core_dumped ? " (core dumped)" : "";
    const char *msg_pre = (msg.len ? " (" : "");
    const char *msg_post = (msg.len ? ")" : "");
    ppl_logevent("Session exited on %s%s%s%.*s%s",
                 sigdesc, core_msg, msg_pre, PTRLEN_PRINTF(msg), msg_post);
}